

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O1

uint NULLC::GetInstructionFromAddress(uintptr_t address)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar4 = *(int *)(currExecutor + 0x1504) - 1;
  uVar5 = 0;
  do {
    uVar1 = uVar4 + uVar5;
    uVar3 = uVar1 >> 1;
    uVar2 = *(ulong *)(*(long *)(currExecutor + 0x14f8) + (ulong)uVar3 * 8);
    if (address < uVar2) {
      uVar4 = uVar3 - 1;
    }
    else {
      if (address <= uVar2) break;
      uVar5 = uVar3 + 1;
    }
  } while (uVar5 <= uVar4);
  uVar4 = 0;
  if (1 < uVar1) {
    uVar4 = uVar3 - (address < *(ulong *)(*(long *)(currExecutor + 0x14f8) + (ulong)uVar3 * 8));
  }
  return uVar4;
}

Assistant:

unsigned GetInstructionFromAddress(uintptr_t address)
	{
		unsigned lowerBound = 0;
		unsigned upperBound = currExecutor->instAddress.size() - 1;
		unsigned index = 0;

		while(lowerBound <= upperBound)
		{
			index = (lowerBound + upperBound) >> 1;

			if(address < uintptr_t(currExecutor->instAddress.data[index]))
				upperBound = index - 1;
			else if(address > uintptr_t(currExecutor->instAddress.data[index]))
				lowerBound = index + 1;
			else
				break;
		}

		if(index != 0 && address < uintptr_t(currExecutor->instAddress.data[index]))
			index--;

		return index;
	}